

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragBehaviorT<unsigned_int,int,float>
               (ImGuiDataType data_type,uint *v,float v_speed,uint v_min,uint v_max,char *format,
               float power,ImGuiDragFlags flags)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  uint uVar4;
  uint in_ECX;
  uint in_EDX;
  uint *in_RSI;
  int in_EDI;
  char *in_R8;
  uint in_R9D;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  float in_XMM0_Da;
  float rhs;
  float in_XMM1_Da;
  float v_cur_norm_curved;
  float v_new_norm_curved;
  float v_old_norm_curved;
  float v_old_ref_for_accum_remainder;
  uint v_cur;
  bool is_drag_direction_change_with_power;
  bool is_already_past_limits_and_pushing_outward;
  bool is_just_activated;
  int decimal_precision;
  float adjust_delta;
  bool is_power;
  bool has_min_max;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiContext *g;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff88;
  bool bVar8;
  undefined1 in_stack_ffffffffffffff89;
  undefined1 in_stack_ffffffffffffff8a;
  undefined1 in_stack_ffffffffffffff8b;
  undefined4 in_stack_ffffffffffffff8c;
  ImGuiInputReadMode local_70;
  float local_5c;
  uint local_58;
  ImVec2 in_stack_ffffffffffffffb0;
  float fVar9;
  float local_14;
  bool local_1;
  
  pIVar2 = GImGui;
  uVar4 = (uint)((in_R9D & 1) != 0);
  bVar5 = in_EDI == 4;
  bVar6 = in_EDI == 5;
  bVar7 = in_EDX != in_ECX;
  bVar1 = false;
  if ((((in_XMM1_Da != 1.0) || (NAN(in_XMM1_Da))) && (bVar1 = false, bVar5 || bVar6)) &&
     (bVar1 = false, bVar7)) {
    bVar1 = (float)(in_ECX - in_EDX) < 3.4028235e+38;
  }
  local_14 = in_XMM0_Da;
  if (((in_XMM0_Da == 0.0) && (!NAN(in_XMM0_Da))) &&
     ((bVar7 && ((float)(in_ECX - in_EDX) < 3.4028235e+38)))) {
    local_14 = (float)(in_ECX - in_EDX) * GImGui->DragSpeedDefaultRatio;
  }
  fVar9 = 0.0;
  if (((GImGui->ActiveIdSource != ImGuiInputSource_Mouse) ||
      (bVar3 = IsMousePosValid((ImVec2 *)0x0), !bVar3)) ||
     ((pIVar2->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
      if (bVar5 || bVar6) {
        local_70 = ImParseFormatPrecision
                             ((char *)CONCAT44(in_stack_ffffffffffffff8c,
                                               CONCAT13(in_stack_ffffffffffffff8b,
                                                        CONCAT12(in_stack_ffffffffffffff8a,
                                                                 CONCAT11(in_stack_ffffffffffffff89,
                                                                          in_stack_ffffffffffffff88)
                                                                ))),in_stack_ffffffffffffff84);
      }
      else {
        local_70 = ImGuiInputReadMode_Down;
      }
      GetNavInputAmount2d((ImGuiNavDirSourceFlags)fVar9,local_70,in_stack_ffffffffffffffb0.y,
                          in_stack_ffffffffffffffb0.x);
      fVar9 = ImVec2::operator[]((ImVec2 *)&stack0xffffffffffffffb0,(long)(int)uVar4);
      rhs = GetMinimumStepAtDecimalPrecision(in_stack_ffffffffffffff80);
      local_14 = ImMax<float>(local_14,rhs);
    }
  }
  else {
    fVar9 = ImVec2::operator[](&(pIVar2->IO).MouseDelta,(long)(int)uVar4);
    if (((pIVar2->IO).KeyAlt & 1U) != 0) {
      fVar9 = fVar9 * 0.01;
    }
    if (((pIVar2->IO).KeyShift & 1U) != 0) {
      fVar9 = fVar9 * 10.0;
    }
  }
  local_14 = local_14 * fVar9;
  if (uVar4 == 1) {
    local_14 = -local_14;
  }
  bVar3 = false;
  if ((bVar7) && ((*in_RSI < in_ECX || (bVar3 = true, local_14 <= 0.0)))) {
    bVar3 = *in_RSI <= in_EDX && local_14 < 0.0;
  }
  bVar8 = false;
  if ((bVar1) &&
     (((0.0 <= local_14 || (bVar8 = true, pIVar2->DragCurrentAccum <= 0.0)) &&
      (bVar8 = false, 0.0 < local_14)))) {
    bVar8 = pIVar2->DragCurrentAccum <= 0.0 && pIVar2->DragCurrentAccum != 0.0;
  }
  if ((((pIVar2->ActiveIdIsJustActivated & 1U) != 0) || (bVar3)) || (bVar8)) {
    pIVar2->DragCurrentAccum = 0.0;
    pIVar2->DragCurrentAccumDirty = false;
  }
  else if ((local_14 != 0.0) || (NAN(local_14))) {
    pIVar2->DragCurrentAccum = local_14 + pIVar2->DragCurrentAccum;
    pIVar2->DragCurrentAccumDirty = true;
  }
  if ((pIVar2->DragCurrentAccumDirty & 1U) == 0) {
    local_1 = false;
  }
  else {
    local_5c = 0.0;
    if (bVar1) {
      local_5c = ImPow(0.0,2.201513e-39);
      ImSaturate(local_5c + pIVar2->DragCurrentAccum / (float)(in_ECX - in_EDX));
      ImPow(0.0,2.20163e-39);
    }
    local_58 = RoundScalarWithFormatT<unsigned_int,int>(in_R8,(ImGuiDataType)in_XMM1_Da,in_R9D);
    pIVar2->DragCurrentAccumDirty = false;
    if (bVar1) {
      fVar9 = ImPow(0.0,2.201848e-39);
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - (fVar9 - local_5c);
    }
    else {
      pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - (float)(int)(local_58 - *in_RSI);
    }
    if (local_58 == 0) {
      local_58 = 0;
    }
    if ((*in_RSI != local_58) && (bVar7)) {
      if ((local_58 < in_EDX) || (((*in_RSI < local_58 && (local_14 < 0.0)) && (!bVar5 && !bVar6))))
      {
        local_58 = in_EDX;
      }
      if ((in_ECX < local_58) || (((local_58 < *in_RSI && (0.0 < local_14)) && (!bVar5 && !bVar6))))
      {
        local_58 = in_ECX;
      }
    }
    if (*in_RSI == local_58) {
      local_1 = false;
    }
    else {
      *in_RSI = local_58;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool has_min_max = (v_min != v_max);
    const bool is_power = (power != 1.0f && is_decimal && has_min_max && (v_max - v_min < FLT_MAX));

    // Default tweak speed
    if (v_speed == 0.0f && has_min_max && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = has_min_max && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (TYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (TYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && has_min_max)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}